

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

bool __thiscall Dependency::mergeIfSameAs(Dependency *this,Dependency *dep2)

{
  int iVar1;
  int iVar2;
  int n;
  int samount;
  Dependency *in_stack_ffffffffffffff68;
  Dependency *this_00;
  undefined4 in_stack_ffffffffffffff88;
  Dependency *in_stack_ffffffffffffff90;
  int local_4c;
  undefined1 local_1;
  
  this_00 = (Dependency *)&stack0xffffffffffffffc8;
  getOriginalFileName_abi_cxx11_(in_stack_ffffffffffffff68);
  iVar1 = std::__cxx11::string::compare((string *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (iVar1 == 0) {
    iVar2 = getSymlinkAmount((Dependency *)0x107ed1);
    for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
      getSymlink_abi_cxx11_(this_00,(int)((ulong)&stack0xffffffffffffff90 >> 0x20));
      addSymlink(in_stack_ffffffffffffff90,(string *)CONCAT44(iVar1,in_stack_ffffffffffffff88));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return (bool)local_1;
}

Assistant:

bool Dependency::mergeIfSameAs(Dependency& dep2)
{
    if(dep2.getOriginalFileName().compare(filename) == 0)
    {
        const int samount = getSymlinkAmount();
        for(int n=0; n<samount; n++) {
            dep2.addSymlink(getSymlink(n));
        }
        return true;
    }
    return false;
}